

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv__platform_loop_init(uv_loop_t *loop)

{
  int *piVar1;
  int local_1c;
  int fd;
  uv_loop_t *loop_local;
  
  local_1c = epoll_create1(0x80000);
  if ((local_1c == -1) &&
     (((piVar1 = __errno_location(), *piVar1 == 0x26 ||
       (piVar1 = __errno_location(), *piVar1 == 0x16)) &&
      (local_1c = epoll_create(0x100), local_1c != -1)))) {
    uv__cloexec_ioctl(local_1c,1);
  }
  loop->backend_fd = local_1c;
  loop->inotify_fd = -1;
  loop->inotify_watchers = (void *)0x0;
  if (local_1c == -1) {
    piVar1 = __errno_location();
    loop_local._4_4_ = -*piVar1;
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv__platform_loop_init(uv_loop_t* loop) {
  int fd;

  /* It was reported that EPOLL_CLOEXEC is not defined on Android API < 21,
   * a.k.a. Lollipop. Since EPOLL_CLOEXEC is an alias for O_CLOEXEC on all
   * architectures, we just use that instead.
   */
#if defined(__ANDROID_API__) && __ANDROID_API__ < 21
  fd = -1;
  errno = ENOSYS;
#else
  fd = epoll_create1(O_CLOEXEC);
#endif

  /* epoll_create1() can fail either because it's not implemented (old kernel)
   * or because it doesn't understand the O_CLOEXEC flag.
   */
  if (fd == -1 && (errno == ENOSYS || errno == EINVAL)) {
    fd = epoll_create(256);

    if (fd != -1)
      uv__cloexec(fd, 1);
  }

  loop->backend_fd = fd;
  loop->inotify_fd = -1;
  loop->inotify_watchers = NULL;

  if (fd == -1)
    return UV__ERR(errno);

  return 0;
}